

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O0

sunrealtype * adapt_mesh(N_Vector y,sunindextype *Nnew,UserData udata)

{
  sunrealtype *psVar1;
  int iVar2;
  long lVar3;
  long *in_RDX;
  long lVar4;
  long *in_RSI;
  undefined8 in_RDI;
  double dVar5;
  sunindextype N_new;
  sunindextype num_refine;
  sunrealtype *xnew;
  sunrealtype *Y;
  sunrealtype *xold;
  sunrealtype ydd;
  int *marks;
  sunindextype j;
  sunindextype i;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  void *pvVar6;
  long local_30;
  long local_28;
  sunrealtype *local_8;
  
  pvVar6 = (void *)0x0;
  psVar1 = (sunrealtype *)in_RDX[1];
  lVar3 = N_VGetArrayPointer(in_RDI);
  iVar2 = check_flag(pvVar6,in_stack_ffffffffffffffa0,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (iVar2 == 0) {
    pvVar6 = calloc(*in_RDX - 1,4);
    for (local_28 = 1; local_28 < *in_RDX + -1; local_28 = local_28 + 1) {
      dVar5 = *(double *)(lVar3 + local_28 * 8);
      dVar5 = ABS((*(double *)(lVar3 + (local_28 + -1) * 8) - (dVar5 + dVar5)) +
                  *(double *)(lVar3 + 8 + local_28 * 8));
      if ((double)in_RDX[3] <= dVar5 && dVar5 != (double)in_RDX[3]) {
        *(undefined4 *)((long)pvVar6 + (local_28 + -1) * 4) = 1;
        *(undefined4 *)((long)pvVar6 + local_28 * 4) = 1;
      }
    }
    lVar3 = 0;
    for (local_28 = 0; local_28 < *in_RDX + -1; local_28 = local_28 + 1) {
      if (*(int *)((long)pvVar6 + local_28 * 4) == 1) {
        lVar3 = lVar3 + 1;
      }
    }
    lVar3 = *in_RDX + lVar3;
    *in_RSI = lVar3;
    local_8 = (sunrealtype *)malloc(lVar3 * 8);
    *local_8 = *psVar1;
    local_8[lVar3 + -1] = psVar1[*in_RDX + -1];
    local_30 = 1;
    for (local_28 = 0; local_28 < *in_RDX + -1; local_28 = local_28 + 1) {
      if (*(int *)((long)pvVar6 + local_28 * 4) == 0) {
        local_8[local_30] = psVar1[local_28 + 1];
        local_30 = local_30 + 1;
      }
      else if (*(int *)((long)pvVar6 + local_28 * 4) == 1) {
        lVar4 = local_30 + 1;
        local_8[local_30] = (psVar1[local_28] + psVar1[local_28 + 1]) * 0.5;
        local_30 = local_30 + 2;
        local_8[lVar4] = psVar1[local_28 + 1];
      }
    }
    for (local_28 = 0; local_28 < lVar3 + -1; local_28 = local_28 + 1) {
      if (local_8[local_28 + 1] <= local_8[local_28]) {
        fprintf(_stderr,"adapt_mesh error: illegal mesh created\n");
        free(local_8);
        return (sunrealtype *)0x0;
      }
    }
    free(pvVar6);
  }
  else {
    local_8 = (sunrealtype *)0x0;
  }
  return local_8;
}

Assistant:

sunrealtype* adapt_mesh(N_Vector y, sunindextype* Nnew, UserData udata)
{
  sunindextype i, j;
  int* marks = NULL;
  sunrealtype ydd, *xold = NULL, *Y = NULL, *xnew = NULL;
  sunindextype num_refine, N_new;

  /* Access current solution and mesh arrays */
  xold = udata->x;
  Y    = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return NULL; }

  /* create marking array */
  marks = calloc(udata->N - 1, sizeof(int));

  /* perform marking:
      0 -> leave alone
      1 -> refine */
  for (i = 1; i < udata->N - 1; i++)
  {
    /* approximate scaled second-derivative */
    ydd = Y[i - 1] - TWO * Y[i] + Y[i + 1];

    /* check for refinement */
    if (SUNRabs(ydd) > udata->refine_tol)
    {
      marks[i - 1] = 1;
      marks[i]     = 1;
    }
  }

  /* allocate new mesh */
  num_refine = 0;
  for (i = 0; i < udata->N - 1; i++)
  {
    if (marks[i] == 1) { num_refine++; }
  }
  N_new = udata->N + num_refine;
  *Nnew = N_new; /* Store new array length */
  xnew  = malloc((N_new) * sizeof(sunrealtype));

  /* fill new mesh */
  xnew[0]         = xold[0]; /* store endpoints */
  xnew[N_new - 1] = xold[udata->N - 1];
  j               = 1;
  /* iterate over old intervals */
  for (i = 0; i < udata->N - 1; i++)
  {
    /* if mark is 0, reuse old interval */
    if (marks[i] == 0)
    {
      xnew[j++] = xold[i + 1];
      continue;
    }

    /* if mark is 1, refine old interval */
    if (marks[i] == 1)
    {
      xnew[j++] = PT5 * (xold[i] + xold[i + 1]);
      xnew[j++] = xold[i + 1];
      continue;
    }
  }

  /* verify that new mesh is legal */
  for (i = 0; i < N_new - 1; i++)
  {
    if (xnew[i + 1] <= xnew[i])
    {
      fprintf(stderr, "adapt_mesh error: illegal mesh created\n");
      free(xnew);
      return NULL;
    }
  }

  free(marks); /* Delete marking array */
  return xnew; /* Return with success */
}